

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O2

void Omega_h::ghost_mesh(Mesh *mesh,Int nlayers,bool verbose)

{
  Int IVar1;
  Int IVar2;
  LO nrroots;
  int iVar3;
  char *pcVar4;
  undefined8 uStack_750;
  Read<long> old_owner_globals;
  undefined1 local_728 [16];
  Remotes vert_use_owners;
  Remotes local_6f0;
  Write<int> local_6d0;
  Remotes new_use_owners;
  RemoteGraph own_verts2own_elems;
  Remotes local_670;
  RemoteGraph local_650;
  RemoteGraph local_620;
  Remotes local_5f0;
  Dist owners2elems;
  Dist elems2owners;
  Dist verts2owners;
  Dist local_420;
  Dist local_390;
  Dist local_300;
  Dist uses2old_owners;
  Dist local_1e0;
  Dist local_150;
  Dist local_c0;
  
  IVar1 = Mesh::nghost_layers(mesh);
  if (IVar1 < 0) {
    pcVar4 = "mesh->nghost_layers() >= 0";
    uStack_750 = 0x67;
  }
  else {
    IVar1 = Mesh::nghost_layers(mesh);
    if (IVar1 < nlayers) {
      IVar1 = Mesh::nghost_layers(mesh);
      get_own_verts2own_elems(&own_verts2own_elems,mesh);
      Mesh::ask_dist(&verts2owners,mesh,0);
      RemoteGraph::RemoteGraph(&local_620,&own_verts2own_elems);
      Dist::Dist(&local_300,&verts2owners);
      close_up(&elems2owners,mesh,&local_620,&local_300);
      Dist::~Dist(&local_300);
      RemoteGraph::~RemoteGraph(&local_620);
      vert_use_owners.idxs.write_.shared_alloc_.alloc = (Alloc *)0x0;
      vert_use_owners.idxs.write_.shared_alloc_.direct_ptr = (void *)0x0;
      vert_use_owners.ranks.write_.shared_alloc_.alloc = (Alloc *)0x0;
      vert_use_owners.ranks.write_.shared_alloc_.direct_ptr = (void *)0x0;
      if (1 < nlayers - IVar1) {
        IVar2 = Mesh::dim(mesh);
        form_down_use_owners((Remotes *)&owners2elems,mesh,IVar2,0);
        Remotes::operator=(&vert_use_owners,(Remotes *)&owners2elems);
        Remotes::~Remotes((Remotes *)&owners2elems);
      }
      for (iVar3 = 1; iVar3 < nlayers - IVar1; iVar3 = iVar3 + 1) {
        Remotes::Remotes(&local_6f0,&vert_use_owners);
        Dist::Dist(&local_390,&elems2owners);
        IVar2 = Mesh::dim(mesh);
        Dist::invert(&owners2elems,&local_390);
        Remotes::Remotes(&local_5f0,&local_6f0);
        Dist::exch(&new_use_owners,&owners2elems,&local_5f0,IVar2 + 1);
        Remotes::~Remotes(&local_5f0);
        Mesh::comm((Mesh *)local_728);
        Remotes::Remotes(&local_670,&new_use_owners);
        nrroots = Mesh::nents(mesh,0);
        Dist::Dist(&uses2old_owners,(CommPtr *)local_728,&local_670,nrroots);
        Remotes::~Remotes(&local_670);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_728 + 8));
        Mesh::globals((Mesh *)&old_owner_globals,(Int)mesh);
        Dist::Dist(&local_150,&uses2old_owners);
        Write<long>::Write(&local_6d0,(Write<int> *)&old_owner_globals);
        get_new_copies2old_owners(&local_c0,&local_150,(GOs *)&local_6d0);
        Write<long>::~Write((Write<long> *)&local_6d0);
        Dist::~Dist(&local_150);
        Write<long>::~Write(&old_owner_globals.write_);
        Dist::~Dist(&uses2old_owners);
        Remotes::~Remotes(&new_use_owners);
        Dist::~Dist(&owners2elems);
        Dist::operator=(&verts2owners,&local_c0);
        Dist::~Dist(&local_c0);
        Dist::~Dist(&local_390);
        Remotes::~Remotes(&local_6f0);
        RemoteGraph::RemoteGraph(&local_650,&own_verts2own_elems);
        Dist::Dist(&local_1e0,&verts2owners);
        close_up(&owners2elems,mesh,&local_650,&local_1e0);
        Dist::operator=(&elems2owners,&owners2elems);
        Dist::~Dist(&owners2elems);
        Dist::~Dist(&local_1e0);
        RemoteGraph::~RemoteGraph(&local_650);
      }
      Dist::Dist(&local_420,&elems2owners);
      migrate_mesh(mesh,&local_420,OMEGA_H_GHOSTED,verbose);
      Dist::~Dist(&local_420);
      Remotes::~Remotes(&vert_use_owners);
      Dist::~Dist(&elems2owners);
      Dist::~Dist(&verts2owners);
      RemoteGraph::~RemoteGraph(&own_verts2own_elems);
      return;
    }
    pcVar4 = "nlayers > mesh->nghost_layers()";
    uStack_750 = 0x68;
  }
  fail("assertion %s failed at %s +%d\n",pcVar4,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_ghost.cpp"
       ,uStack_750);
}

Assistant:

void ghost_mesh(Mesh* mesh, Int nlayers, bool verbose) {
  OMEGA_H_CHECK(mesh->nghost_layers() >= 0);
  OMEGA_H_CHECK(nlayers > mesh->nghost_layers());
  auto nnew_layers = nlayers - mesh->nghost_layers();
  auto own_verts2own_elems = get_own_verts2own_elems(mesh);
  auto verts2owners = mesh->ask_dist(VERT);
  auto elems2owners = close_up(mesh, own_verts2own_elems, verts2owners);
  auto vert_use_owners = Remotes();
  if (nnew_layers > 1) {
    vert_use_owners = form_down_use_owners(mesh, mesh->dim(), VERT);
  }
  for (Int i = 1; i < nnew_layers; ++i) {
    verts2owners = close_down(mesh, vert_use_owners, elems2owners);
    elems2owners = close_up(mesh, own_verts2own_elems, verts2owners);
  }
  migrate_mesh(mesh, elems2owners, OMEGA_H_GHOSTED, verbose);
}